

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::ShadedRenderer<ImPlot::GetterYs<short>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLin>::
operator()(ShadedRenderer<ImPlot::GetterYs<short>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLin>
           *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  double dVar8;
  int iVar9;
  int iVar10;
  GetterYs<short> *pGVar11;
  GetterYRef *pGVar12;
  ImDrawVert *pIVar13;
  ImDrawIdx *pIVar14;
  ImVec2 IVar15;
  ushort uVar16;
  bool bVar17;
  ImPlotContext *gp;
  ImDrawIdx IVar18;
  uint uVar19;
  double dVar20;
  float fVar21;
  float fVar22;
  double dVar23;
  float fVar24;
  ImVec2 IVar25;
  float fVar26;
  double dVar27;
  ImVec2 IVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  
  dVar20 = (double)(prim + 1);
  pGVar11 = this->Getter1;
  pGVar12 = this->Getter2;
  iVar9 = pGVar11->Count;
  iVar10 = this->Transformer->YAxis;
  dVar23 = (double)GImPlot->PixelRange[iVar10].Min.x;
  dVar7 = (GImPlot->CurrentPlot->XAxis).Range.Min;
  fVar21 = (float)(((pGVar11->XScale * dVar20 + pGVar11->X0) - dVar7) * GImPlot->Mx + dVar23);
  dVar27 = (double)GImPlot->PixelRange[iVar10].Min.y;
  dVar8 = GImPlot->CurrentPlot->YAxis[iVar10].Range.Min;
  fVar24 = (float)(((double)(int)*(short *)((long)pGVar11->Ys +
                                           (long)(((prim + 1 + pGVar11->Offset) % iVar9 + iVar9) %
                                                 iVar9) * (long)pGVar11->Stride) - dVar8) *
                   GImPlot->My[iVar10] + dVar27);
  fVar29 = (float)(((dVar20 * pGVar12->XScale + pGVar12->X0) - dVar7) * GImPlot->Mx + dVar23);
  fVar30 = (float)((pGVar12->YRef - dVar8) * GImPlot->My[iVar10] + dVar27);
  fVar2 = (this->P11).x;
  fVar3 = (this->P12).x;
  fVar4 = (this->P11).y;
  fVar5 = (this->P12).y;
  fVar26 = fVar4;
  if (fVar5 <= fVar4) {
    fVar26 = fVar5;
  }
  if (fVar24 <= fVar26) {
    fVar26 = fVar24;
  }
  if (fVar30 <= fVar26) {
    fVar26 = fVar30;
  }
  bVar17 = false;
  if ((fVar26 < (cull_rect->Max).y) &&
     (fVar26 = (float)(~-(uint)(fVar5 <= fVar4) & (uint)fVar5 |
                      -(uint)(fVar5 <= fVar4) & (uint)fVar4), uVar19 = -(uint)(fVar24 <= fVar26),
     fVar26 = (float)(~uVar19 & (uint)fVar24 | uVar19 & (uint)fVar26),
     uVar19 = -(uint)(fVar30 <= fVar26),
     fVar26 = (float)(~uVar19 & (uint)fVar30 | uVar19 & (uint)fVar26), pfVar1 = &(cull_rect->Min).y,
     bVar17 = false, *pfVar1 <= fVar26 && fVar26 != *pfVar1)) {
    fVar26 = fVar2;
    if (fVar3 <= fVar2) {
      fVar26 = fVar3;
    }
    if (fVar21 <= fVar26) {
      fVar26 = fVar21;
    }
    if (fVar29 <= fVar26) {
      fVar26 = fVar29;
    }
    if (fVar26 < (cull_rect->Max).x) {
      fVar26 = (float)(~-(uint)(fVar3 <= fVar2) & (uint)fVar3 |
                      -(uint)(fVar3 <= fVar2) & (uint)fVar2);
      uVar19 = -(uint)(fVar21 <= fVar26);
      fVar26 = (float)(~uVar19 & (uint)fVar21 | uVar19 & (uint)fVar26);
      uVar19 = -(uint)(fVar29 <= fVar26);
      fVar26 = (float)(~uVar19 & (uint)fVar29 | uVar19 & (uint)fVar26);
      bVar17 = (cull_rect->Min).x <= fVar26 && fVar26 != (cull_rect->Min).x;
    }
  }
  IVar25.y = fVar24;
  IVar25.x = fVar21;
  IVar28.y = fVar30;
  IVar28.x = fVar29;
  if (bVar17 != false) {
    fVar26 = (this->P11).y;
    fVar6 = (this->P12).y;
    fVar32 = fVar2 * fVar24 - fVar21 * fVar4;
    fVar31 = fVar3 * fVar30 - fVar29 * fVar5;
    fVar22 = (fVar2 - fVar21) * (fVar5 - fVar30) - (fVar3 - fVar29) * (fVar4 - fVar24);
    DrawList->_VtxWritePtr->pos = this->P11;
    DrawList->_VtxWritePtr->uv = *uv;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13->col = this->Col;
    pIVar13[1].pos = IVar25;
    DrawList->_VtxWritePtr[1].uv = *uv;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[1].col = this->Col;
    IVar15.y = ((fVar5 - fVar30) * fVar32 - (fVar4 - fVar24) * fVar31) / fVar22;
    IVar15.x = (fVar32 * (fVar3 - fVar29) - (fVar2 - fVar21) * fVar31) / fVar22;
    pIVar13[2].pos = IVar15;
    DrawList->_VtxWritePtr[2].uv = *uv;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[2].col = this->Col;
    pIVar13[3].pos = this->P12;
    DrawList->_VtxWritePtr[3].uv = *uv;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[3].col = this->Col;
    pIVar13[4].pos = IVar28;
    DrawList->_VtxWritePtr[4].uv = *uv;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[4].col = this->Col;
    DrawList->_VtxWritePtr = pIVar13 + 5;
    uVar19 = DrawList->_VtxCurrentIdx;
    pIVar14 = DrawList->_IdxWritePtr;
    IVar18 = (ImDrawIdx)uVar19;
    *pIVar14 = IVar18;
    uVar16 = -(ushort)(fVar6 < fVar26 && fVar24 < fVar30 || fVar26 < fVar6 && fVar30 < fVar24) & 1;
    pIVar14[1] = IVar18 + uVar16 + 1;
    pIVar14[2] = IVar18 + 3;
    pIVar14[3] = IVar18 + 1;
    pIVar14[4] = (uVar16 ^ 3) + IVar18;
    pIVar14[5] = IVar18 + 4;
    DrawList->_IdxWritePtr = pIVar14 + 6;
    DrawList->_VtxCurrentIdx = uVar19 + 5;
  }
  this->P11 = IVar25;
  this->P12 = IVar28;
  return bVar17;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        ImRect rect(ImMin(ImMin(ImMin(P11,P12),P21),P22), ImMax(ImMax(ImMax(P11,P12),P21),P22));
        if (!cull_rect.Overlaps(rect)) {
            P11 = P21;
            P12 = P22;
            return false;
        }
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }